

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O3

void apply_mapping(NS *base,
                  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                  *base_to_template)

{
  _Rb_tree_header *p_Var1;
  mapped_type pNVar2;
  undefined8 *puVar3;
  key_type *__k;
  N *pNVar4;
  long *plVar5;
  long *plVar6;
  mapped_type *ppNVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  runtime_error *this;
  pointer ppNVar10;
  nodeit *pnVar11;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var12;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar13;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var14;
  initializer_list<N_*> ns;
  N *p;
  N *o;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> nested_connections;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> template_connections;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  added;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  deleted;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> nested_to_template;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> template_to_base;
  N *local_190;
  N *local_188;
  N *local_180;
  nodeit local_178;
  void *local_158;
  undefined8 uStack_150;
  long local_148;
  void *local_138;
  undefined8 uStack_130;
  long local_128;
  _Rb_tree_node_base *local_118;
  N *local_110;
  N *local_108;
  _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  local_100;
  _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  _Stack_d0;
  _Rb_tree_node_base *p_Stack_a0;
  pointer local_98;
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  local_90;
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(base_to_template->_M_t)._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      pNVar2 = *(mapped_type *)(p_Var8 + 1);
      ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                            *)&local_60,(key_type *)&p_Var8[1]._M_parent);
      *ppNVar7 = pNVar2;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    p_Var8 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      pNVar2 = *(mapped_type *)(p_Var8 + 1);
      if ((*(__index_type *)
            ((long)&(pNVar2->data).
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
            + 0x20) == '\x03') &&
         (puVar3 = *(undefined8 **)
                    &(pNVar2->data).
                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                     ._M_u, __k = (key_type *)*puVar3, puVar3[1] - (long)__k == 8)) {
        ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                  operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                              *)&local_90,__k);
        *ppNVar7 = pNVar2;
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    p_Var8 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Stack_a0 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      pNVar4 = *(N **)(p_Var8 + 1);
      if (*(__index_type *)
           ((long)&(pNVar4->data).
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                   .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
           + 0x20) == '\x03') {
        plVar5 = *(long **)&(pNVar4->data).
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            ._M_u;
        plVar6 = (long *)*plVar5;
        local_118 = p_Var8;
        if (plVar5[1] - (long)plVar6 != 8) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"Node creation/deletion in rewriting is not yet implemented");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_108 = (N *)p_Var8[1]._M_parent;
        local_110 = (N *)*plVar6;
        local_128 = 0;
        local_138 = (void *)0x0;
        uStack_130 = 0;
        local_148 = 0;
        local_158 = (void *)0x0;
        uStack_150 = 0;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_d0._M_impl.super__Rb_tree_header._M_header;
        _Stack_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_100._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_100._M_impl.super__Rb_tree_header._M_header;
        local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
        ppNVar10 = (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_98 = (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_188 = pNVar4;
        local_100._M_impl.super__Rb_tree_header._M_header._M_right =
             local_100._M_impl.super__Rb_tree_header._M_header._M_left;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (ppNVar10 != local_98) {
          do {
            local_190 = *ppNVar10;
            N::operator[](&local_178,local_188,local_190);
            pCVar13 = &local_178;
            do {
              pnVar11 = pCVar13;
              pCVar13 = pnVar11->next;
            } while (pCVar13 !=
                     (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)0x0);
            pNVar4 = (N *)(pnVar11->_end)._M_current;
            _Var12._M_current = local_178._end._M_current;
            pCVar13 = local_178.next;
            _Var14._M_current = local_178._start._M_current;
            while ((N *)_Var14._M_current != pNVar4 ||
                   pCVar13 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) {
              local_180 = (N *)(((N *)_Var14._M_current)->osi).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                        ((vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>> *)&local_138,
                         &local_190,&local_180);
              _Var14._M_current =
                   (N **)&(((N *)_Var14._M_current)->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if ((pCVar13 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) && (_Var14._M_current == _Var12._M_current)) {
                _Var12._M_current = (pCVar13->_end)._M_current;
                _Var14._M_current = (pCVar13->_curr)._M_current;
                pCVar13 = pCVar13->next;
              }
            }
            ppNVar10 = ppNVar10 + 1;
          } while (ppNVar10 != local_98);
        }
        ppNVar10 = (local_110->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_188 = (N *)(local_110->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        if ((N *)ppNVar10 != local_188) {
          do {
            local_190 = *ppNVar10;
            N::operator[](&local_178,local_110,local_190);
            pCVar13 = &local_178;
            do {
              pnVar11 = pCVar13;
              pCVar13 = pnVar11->next;
            } while (pCVar13 !=
                     (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)0x0);
            pNVar4 = (N *)(pnVar11->_end)._M_current;
            _Var12._M_current = local_178._end._M_current;
            pCVar13 = local_178.next;
            _Var14._M_current = local_178._start._M_current;
            while ((N *)_Var14._M_current != pNVar4 ||
                   pCVar13 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) {
              local_180 = (N *)(((N *)_Var14._M_current)->osi).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                        ((vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>> *)&local_158,
                         &local_190,&local_180);
              _Var14._M_current =
                   (N **)&(((N *)_Var14._M_current)->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if ((pCVar13 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) && (_Var14._M_current == _Var12._M_current)) {
                _Var12._M_current = (pCVar13->_end)._M_current;
                _Var14._M_current = (pCVar13->_curr)._M_current;
                pCVar13 = pCVar13->next;
              }
            }
            ppNVar10 = ppNVar10 + 1;
          } while ((N *)ppNVar10 != local_188);
        }
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_138,uStack_130,local_158,uStack_150,&_Stack_d0,
                   _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left);
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_158,uStack_150,local_138,uStack_130,&local_100,
                   local_100._M_impl.super__Rb_tree_header._M_header._M_left);
        for (p_Var9 = _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var8 = local_100._M_impl.super__Rb_tree_header._M_header._M_left,
            (_Rb_tree_header *)p_Var9 != &_Stack_d0._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          pNVar4 = *(N **)(p_Var9 + 1);
          local_178._end._M_current = (N **)p_Var9[1]._M_parent;
          local_178._start._M_current = (N **)pNVar4;
          ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                    operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                *)&local_90,(key_type *)&local_178._end);
          ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                    operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                *)&local_60,ppNVar7);
          local_190 = *ppNVar7;
          ns._M_len = 1;
          ns._M_array = (iterator)&local_190;
          N::disconnect(local_108,pNVar4,ns);
        }
        for (; (_Rb_tree_header *)p_Var8 != &local_100._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          pNVar4 = *(N **)(p_Var8 + 1);
          local_178._end._M_current = (N **)p_Var8[1]._M_parent;
          local_178._start._M_current = (N **)pNVar4;
          ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                    operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                *)&local_90,(key_type *)&local_178._end);
          ppNVar7 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                    operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                *)&local_60,ppNVar7);
          local_190 = *ppNVar7;
          N::connect(local_108,(int)pNVar4,(sockaddr *)&local_190,1);
        }
        std::
        _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
        ::~_Rb_tree(&local_100);
        std::
        _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
        ::~_Rb_tree(&_Stack_d0);
        if (local_158 != (void *)0x0) {
          operator_delete(local_158,local_148 - (long)local_158);
        }
        p_Var8 = local_118;
        if (local_138 != (void *)0x0) {
          operator_delete(local_138,local_128 - (long)local_138);
          p_Var8 = local_118;
        }
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Stack_a0);
  }
  std::
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void apply_mapping(NS* base, std::map<N*, N*>& base_to_template) {
    std::map<N*, N*> template_to_base;
    for (auto&& p : base_to_template)
        template_to_base[p.second] = p.first;


    std::map<N*, N*> nested_to_template;
    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() == 1){
                nested_to_template[(*g)->_os[0]] = template_n;
            }
        }
    }


    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() != 1) throw std::runtime_error("Node creation/deletion in rewriting is not yet implemented");
            N* nested_n = (*g)->_os[0];
            std::vector<std::pair<N*, N*>> template_connections, nested_connections;
            std::set<std::pair<N*, N*>> deleted, added;
            for (N* p : template_n->ps) for (N* o : (*template_n)[p]) template_connections.emplace_back(p, o);
            for (N* p : nested_n->ps) for (N* o : (*nested_n)[p]) nested_connections.emplace_back(p, o);
            std::set_difference(template_connections.begin(), template_connections.end(), nested_connections.begin(), nested_connections.end(), std::inserter(deleted, deleted.begin()));
            std::set_difference(nested_connections.begin(), nested_connections.end(), template_connections.begin(), template_connections.end(), std::inserter(added, added.begin()));
            //for (auto [p, o] : deleted) std::cout << "delete " << *base_n << " |" << *p << "> " << *o << std::endl;
            for (auto [p, o] : deleted) base_n->disconnect(p, {template_to_base[nested_to_template[o]]});
            for (auto [p, o] : added) base_n->connect(p, {template_to_base[nested_to_template[o]]});
        }
    }
}